

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void testing::internal::ReportUninterestingCall(CallReaction reaction,string *msg)

{
  bool bVar1;
  uint stack_frames_to_skip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gmock_verbose_abi_cxx11_,"info");
  stack_frames_to_skip = bVar1 - 1 | 3;
  if (reaction == kDefault) {
    std::operator+(&local_40,msg,
                   "\nNOTE: You can safely ignore the above warning unless this call should not happen.  Do not suppress it by blindly adding an EXPECT_CALL() if you don\'t mean to enforce the call.  See https://github.com/google/googletest/blob/master/googlemock/docs/CookBook.md#knowing-when-to-expect for details.\n"
                  );
    Log(kWarning,&local_40,stack_frames_to_skip);
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  if (reaction == kAllow) {
    Log(kInfo,msg,stack_frames_to_skip);
    return;
  }
  Expect(false,(char *)0x0,-1,msg);
  return;
}

Assistant:

void ReportUninterestingCall(CallReaction reaction, const string& msg) {
  // Include a stack trace only if --gmock_verbose=info is specified.
  const int stack_frames_to_skip =
      GMOCK_FLAG(verbose) == kInfoVerbosity ? 3 : -1;
  switch (reaction) {
    case kAllow:
      Log(kInfo, msg, stack_frames_to_skip);
      break;
    case kWarn:
      Log(kWarning,
          msg +
          "\nNOTE: You can safely ignore the above warning unless this "
          "call should not happen.  Do not suppress it by blindly adding "
          "an EXPECT_CALL() if you don't mean to enforce the call.  "
          "See https://github.com/google/googletest/blob/master/googlemock/docs/CookBook.md#"
          "knowing-when-to-expect for details.\n",
          stack_frames_to_skip);
      break;
    default:  // FAIL
      Expect(false, NULL, -1, msg);
  }
}